

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::Process
          (ReplaceDescArrayAccessUsingVarIndex *this)

{
  Module *pMVar1;
  Instruction *var_00;
  bool bVar2;
  Status SVar3;
  Instruction *var;
  Instruction **ppIVar4;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  SVar3 = SuccessWithoutChange;
  ppIVar4 = (Instruction **)
            ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (var_00 = *ppIVar4,
        var_00 != (Instruction *)
                  ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
    bVar2 = descsroautil::IsDescriptorArray((this->super_Pass).context_,var_00);
    if (bVar2) {
      bVar2 = ReplaceVariableAccessesWithConstantElements(this,var_00);
      if (bVar2) {
        SVar3 = SuccessWithChange;
      }
    }
    ppIVar4 = &(var_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return SVar3;
}

Assistant:

Pass::Status ReplaceDescArrayAccessUsingVarIndex::Process() {
  Status status = Status::SuccessWithoutChange;
  for (Instruction& var : context()->types_values()) {
    if (descsroautil::IsDescriptorArray(context(), &var)) {
      if (ReplaceVariableAccessesWithConstantElements(&var))
        status = Status::SuccessWithChange;
    }
  }
  return status;
}